

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_connect.cpp
# Opt level: O1

void __thiscall tst_helpers_connect::rejectTwoSendersDestroyed(tst_helpers_connect *this)

{
  QSharedData *pQVar1;
  undefined8 uVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  QObject *pQVar6;
  Object *this_00;
  int *piVar7;
  QEvent *this_01;
  char *pcVar8;
  char *pcVar9;
  QThread *in_RCX;
  PromiseFromSignal<void_(Object::*)()> p;
  Object *s1;
  Object *s0;
  bool local_54 [4];
  undefined1 local_50 [16];
  Object *local_40;
  QObject *local_38;
  code *local_30;
  undefined8 uStack_28;
  
  pQVar6 = (QObject *)operator_new(0x18);
  *(undefined8 *)pQVar6 = 0;
  *(undefined8 *)(pQVar6 + 8) = 0;
  *(undefined8 *)(pQVar6 + 0x10) = 0;
  QObject::QObject(pQVar6,(QObject *)0x0);
  *(undefined ***)pQVar6 = &PTR_metaObject_0012acd0;
  *(undefined4 *)(pQVar6 + 0x10) = 0;
  local_38 = pQVar6;
  this_00 = (Object *)operator_new(0x18);
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)&this_00->field_0x8 = 0;
  *(undefined8 *)&this_00->m_connections = 0;
  QObject::QObject((QObject *)this_00,(QObject *)0x0);
  *(undefined ***)this_00 = &PTR_metaObject_0012acd0;
  this_00->m_connections = 0;
  local_40 = this_00;
  pQVar6 = (QObject *)QThread::currentThread();
  if (pQVar6 == (QObject *)0x0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar6);
  }
  if (piVar7 == (int *)0x0) goto LAB_0010b69a;
  if ((pQVar6 != (QObject *)0x0) && (piVar7[1] != 0)) {
    cVar3 = QThread::isFinished();
    if (cVar3 == '\0') {
      in_RCX = (QThread *)0x0;
      if (piVar7[1] == 0) {
        pQVar6 = (QObject *)in_RCX;
      }
      pQVar6 = (QObject *)QAbstractEventDispatcher::instance((QThread *)pQVar6);
      if (pQVar6 == (QObject *)0x0) {
        cVar3 = QCoreApplication::closingDown();
        if (cVar3 != '\0') goto LAB_0010b68d;
      }
      this_01 = (QEvent *)operator_new(0x20);
      QEvent::QEvent(this_01,None);
      *(undefined ***)this_01 = &PTR__Event_0012a5f0;
      *(Object ***)(this_01 + 0x10) = &local_40;
      *(QObject ***)(this_01 + 0x18) = &local_38;
      QCoreApplication::postEvent(pQVar6,this_01,0);
    }
  }
LAB_0010b68d:
  LOCK();
  *piVar7 = *piVar7 + -1;
  UNLOCK();
  if (*piVar7 == 0) {
    operator_delete(piVar7);
  }
LAB_0010b69a:
  local_30 = Object::twoArgsSignal;
  uStack_28 = 0;
  QtPromise::connect<Object,void(Object::*)(),Object,void(Object::*)(int,QString_const&)>
            ((Object *)local_50,(offset_in_Object_to_subr)local_38,local_40,
             (offset_in_Object_to_subr)in_RCX);
  uVar2 = local_50._8_8_;
  bVar4 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    ((PromiseDataBase<void,_void_()> *)local_50._8_8_);
  local_30 = (code *)CONCAT71(local_30._1_7_,bVar4);
  local_54[0] = true;
  pcVar8 = QTest::toString<bool>((bool *)&local_30);
  pcVar9 = QTest::toString<bool>(local_54);
  cVar3 = QTest::compare_helper
                    (bVar4,"Compared values are not the same",pcVar8,pcVar9,"p.isPending()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                     ,0xd3);
  if (cVar3 != '\0') {
    local_30 = (code *)CONCAT44(local_30._4_4_,0xffffffff);
    local_54[0] = true;
    local_54[1] = false;
    local_54[2] = false;
    local_54[3] = false;
    iVar5 = waitForValue<int>((QPromise<void> *)local_50,(int *)&local_30,(int *)local_54);
    QTest::qCompare(iVar5,0x2a,"waitForValue(p, -1, 42)","42",
                    "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                    ,0xd4);
  }
  local_50._0_8_ = &PTR__QPromiseBase_0012a6a0;
  LOCK();
  pQVar1 = &((PromiseDataBase<void,_void_()> *)uVar2)->super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i == 0) &&
     ((PromiseDataBase<void,_void_()> *)local_50._8_8_ != (PromiseDataBase<void,_void_()> *)0x0)) {
    (*((PromiseDataBase<void,_void_()> *)local_50._8_8_)->_vptr_PromiseDataBase[1])();
  }
  return;
}

Assistant:

void tst_helpers_connect::rejectTwoSendersDestroyed()
{
    auto s0 = new Object{};
    auto s1 = new Object{};

    QtPromisePrivate::qtpromise_defer([&]() {
        QObject::connect(s1, &QObject::destroyed, [&]() {
            // Let's first delete s1, then resolve s0 and make sure
            // we don't reject when the rejecter object is destroyed.
            Q_EMIT s0->noArgSignal();
        });

        s1->deleteLater();
    });

    auto p = QtPromise::connect(s0, &Object::noArgSignal, s1, &Object::twoArgsSignal);
    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<void>>::value));
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForValue(p, -1, 42), 42);
}